

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  vfloat<4> vVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  ulong uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  byte bVar28;
  byte bVar29;
  int iVar30;
  AABBNodeMB4D *node1;
  byte bVar31;
  long lVar32;
  byte bVar33;
  uint uVar34;
  NodeRef root;
  size_t sVar35;
  uint uVar36;
  NodeRef *pNVar37;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar38;
  undefined4 uVar39;
  ulong uVar40;
  bool bVar41;
  byte bVar42;
  ulong uVar43;
  ulong uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  vint4 ai_2;
  undefined1 auVar76 [16];
  undefined1 in_ZMM2 [64];
  vint4 ai_1;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  vint4 ai_3;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  vint4 bi;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  vint4 bi_1;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  vint4 bi_3;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  vint4 bi_2;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  vint4 ai;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  Precalculations pre;
  undefined1 local_1928 [16];
  BVH *local_1910;
  Intersectors *local_1908;
  ulong local_1900;
  undefined1 local_18f8 [16];
  RTCFilterFunctionNArguments args;
  TravRayK<4,_true> tray;
  undefined1 local_17d8 [16];
  undefined1 local_17c8 [16];
  undefined1 local_17b8 [16];
  undefined1 local_17a8 [16];
  undefined1 local_1798 [16];
  undefined1 local_1788 [8];
  float fStack_1780;
  float fStack_177c;
  undefined1 local_1778 [8];
  float fStack_1770;
  float fStack_176c;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  uint uStack_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  local_1910 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_1910->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar45 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar68 = ZEXT816(0) << 0x40;
    uVar11 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar68,5);
    uVar43 = vpcmpeqd_avx512vl(auVar45,(undefined1  [16])valid_i->field_0);
    uVar43 = ((byte)uVar11 & 0xf) & uVar43;
    bVar42 = (byte)uVar43;
    if (bVar42 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar93 = ZEXT1664(auVar45);
      auVar46 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar45);
      auVar49._8_4_ = 0x219392ef;
      auVar49._0_8_ = 0x219392ef219392ef;
      auVar49._12_4_ = 0x219392ef;
      uVar40 = vcmpps_avx512vl(auVar46,auVar49,1);
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar94 = ZEXT1664(auVar46);
      auVar47 = vdivps_avx512vl(auVar46,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar48 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar45);
      uVar44 = vcmpps_avx512vl(auVar48,auVar49,1);
      auVar48 = vdivps_avx512vl(auVar46,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar45 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar45);
      uVar12 = vcmpps_avx512vl(auVar45,auVar49,1);
      auVar45 = vdivps_avx512vl(auVar46,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      bVar41 = (bool)((byte)uVar40 & 1);
      tray.rdir.field_0._0_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar47._0_4_;
      bVar41 = (bool)((byte)(uVar40 >> 1) & 1);
      tray.rdir.field_0._4_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar47._4_4_;
      bVar41 = (bool)((byte)(uVar40 >> 2) & 1);
      tray.rdir.field_0._8_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar47._8_4_;
      bVar41 = (bool)((byte)(uVar40 >> 3) & 1);
      tray.rdir.field_0._12_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar47._12_4_;
      bVar41 = (bool)((byte)uVar44 & 1);
      tray.rdir.field_0._16_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar48._0_4_;
      bVar41 = (bool)((byte)(uVar44 >> 1) & 1);
      tray.rdir.field_0._20_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar48._4_4_;
      bVar41 = (bool)((byte)(uVar44 >> 2) & 1);
      tray.rdir.field_0._24_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar48._8_4_;
      bVar41 = (bool)((byte)(uVar44 >> 3) & 1);
      tray.rdir.field_0._28_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar48._12_4_;
      bVar41 = (bool)((byte)uVar12 & 1);
      tray.rdir.field_0._32_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar45._0_4_;
      bVar41 = (bool)((byte)(uVar12 >> 1) & 1);
      tray.rdir.field_0._36_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar45._4_4_;
      bVar41 = (bool)((byte)(uVar12 >> 2) & 1);
      tray.rdir.field_0._40_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar45._8_4_;
      bVar41 = (bool)((byte)(uVar12 >> 3) & 1);
      tray.rdir.field_0._44_4_ = (uint)bVar41 * 0x5d5e0b6b | (uint)!bVar41 * auVar45._12_4_;
      uVar40 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar68,1);
      auVar45 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar40 & 1) * auVar45._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar45._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar45._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar45._12_4_;
      uVar40 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar68,5);
      auVar45 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar41 = (bool)((byte)uVar40 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar41 * auVar45._0_4_ | (uint)!bVar41 * 0x30;
      bVar41 = (bool)((byte)(uVar40 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar41 * auVar45._4_4_ | (uint)!bVar41 * 0x30;
      bVar41 = (bool)((byte)(uVar40 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar41 * auVar45._8_4_ | (uint)!bVar41 * 0x30;
      bVar41 = (bool)((byte)(uVar40 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar41 * auVar45._12_4_ | (uint)!bVar41 * 0x30;
      uVar40 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar68,5);
      auVar45 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar41 = (bool)((byte)uVar40 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar41 * auVar45._0_4_ | (uint)!bVar41 * 0x50;
      bVar41 = (bool)((byte)(uVar40 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar41 * auVar45._4_4_ | (uint)!bVar41 * 0x50;
      bVar41 = (bool)((byte)(uVar40 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar41 * auVar45._8_4_ | (uint)!bVar41 * 0x50;
      bVar41 = (bool)((byte)(uVar40 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar41 * auVar45._12_4_ | (uint)!bVar41 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar95 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar45 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar68);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar42 & 1) * auVar45._0_4_ |
           (uint)!(bool)(bVar42 & 1) * stack_near[0].field_0._0_4_;
      bVar41 = (bool)((byte)(uVar43 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar41 * auVar45._4_4_ | (uint)!bVar41 * stack_near[0].field_0._4_4_;
      bVar41 = (bool)((byte)(uVar43 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar41 * auVar45._8_4_ | (uint)!bVar41 * stack_near[0].field_0._8_4_;
      bVar41 = SUB81(uVar43 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar41 * auVar45._12_4_ | (uint)!bVar41 * stack_near[0].field_0._12_4_;
      auVar45 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar68);
      tray.tfar.field_0.i[0] =
           (uint)(bVar42 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar42 & 1) * -0x800000;
      bVar41 = (bool)((byte)(uVar43 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar41 * auVar45._4_4_ | (uint)!bVar41 * -0x800000;
      bVar41 = (bool)((byte)(uVar43 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar41 * auVar45._8_4_ | (uint)!bVar41 * -0x800000;
      bVar41 = SUB81(uVar43 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar41 * auVar45._12_4_ | (uint)!bVar41 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar36 = 3;
      }
      else {
        uVar36 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      bVar29 = (byte)((ushort)((short)uVar43 << 0xc) >> 0xc) ^ 0xf;
      pNVar37 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar38 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar96 = ZEXT1664(auVar45);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar97 = ZEXT1664(auVar45);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
      auVar98 = ZEXT1664(auVar45);
      local_1908 = This;
LAB_01f3fc3b:
      do {
        do {
          root.ptr = pNVar37[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01f4076b;
          pNVar37 = pNVar37 + -1;
          paVar38 = paVar38 + -1;
          vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar38->v;
          auVar75 = ZEXT1664((undefined1  [16])vVar2.field_0);
          uVar43 = vcmpps_avx512vl((undefined1  [16])vVar2.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar43 == '\0');
        uVar39 = (undefined4)uVar43;
        if (uVar36 < (uint)POPCOUNT(uVar39)) {
LAB_01f3fc83:
          do {
            uVar34 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01f4076b;
              uVar11 = vcmpps_avx512vl(auVar75._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar11 == '\0') goto LAB_01f3fc3b;
              bVar28 = bVar29 & 0xf;
              local_1900 = (ulong)(uVar34 & 0xf) - 8;
              if (local_1900 == 0) goto LAB_01f4073b;
              bVar28 = bVar28 ^ 0xf;
              lVar32 = (root.ptr & 0xfffffffffffffff0) + 0x130;
              uVar43 = 0;
              goto LAB_01f40012;
            }
            uVar11 = vcmpps_avx512vl(auVar75._0_16_,(undefined1  [16])tray.tfar.field_0,9);
            uVar43 = root.ptr & 0xfffffffffffffff0;
            lVar32 = -0x10;
            sVar35 = 8;
            auVar45 = auVar95._0_16_;
            do {
              root.ptr = *(size_t *)(uVar43 + 0x20 + lVar32 * 2);
              if (root.ptr == 8) {
                auVar75 = ZEXT1664(auVar45);
                root.ptr = sVar35;
                break;
              }
              uVar39 = *(undefined4 *)(uVar43 + 0x90 + lVar32);
              auVar76._4_4_ = uVar39;
              auVar76._0_4_ = uVar39;
              auVar76._8_4_ = uVar39;
              auVar76._12_4_ = uVar39;
              auVar68 = *(undefined1 (*) [16])(ray + 0x70);
              uVar39 = *(undefined4 *)(uVar43 + 0x30 + lVar32);
              auVar17._4_4_ = uVar39;
              auVar17._0_4_ = uVar39;
              auVar17._8_4_ = uVar39;
              auVar17._12_4_ = uVar39;
              auVar46 = vfmadd213ps_avx512vl(auVar76,auVar68,auVar17);
              uVar39 = *(undefined4 *)(uVar43 + 0xb0 + lVar32);
              auVar77._4_4_ = uVar39;
              auVar77._0_4_ = uVar39;
              auVar77._8_4_ = uVar39;
              auVar77._12_4_ = uVar39;
              uVar39 = *(undefined4 *)(uVar43 + 0x50 + lVar32);
              auVar18._4_4_ = uVar39;
              auVar18._0_4_ = uVar39;
              auVar18._8_4_ = uVar39;
              auVar18._12_4_ = uVar39;
              auVar47 = vfmadd213ps_avx512vl(auVar77,auVar68,auVar18);
              uVar39 = *(undefined4 *)(uVar43 + 0xd0 + lVar32);
              auVar79._4_4_ = uVar39;
              auVar79._0_4_ = uVar39;
              auVar79._8_4_ = uVar39;
              auVar79._12_4_ = uVar39;
              uVar39 = *(undefined4 *)(uVar43 + 0x70 + lVar32);
              auVar19._4_4_ = uVar39;
              auVar19._0_4_ = uVar39;
              auVar19._8_4_ = uVar39;
              auVar19._12_4_ = uVar39;
              auVar48 = vfmadd213ps_avx512vl(auVar79,auVar68,auVar19);
              uVar39 = *(undefined4 *)(uVar43 + 0xa0 + lVar32);
              auVar81._4_4_ = uVar39;
              auVar81._0_4_ = uVar39;
              auVar81._8_4_ = uVar39;
              auVar81._12_4_ = uVar39;
              uVar39 = *(undefined4 *)(uVar43 + 0x40 + lVar32);
              auVar20._4_4_ = uVar39;
              auVar20._0_4_ = uVar39;
              auVar20._8_4_ = uVar39;
              auVar20._12_4_ = uVar39;
              auVar49 = vfmadd213ps_avx512vl(auVar81,auVar68,auVar20);
              uVar39 = *(undefined4 *)(uVar43 + 0xc0 + lVar32);
              auVar84._4_4_ = uVar39;
              auVar84._0_4_ = uVar39;
              auVar84._8_4_ = uVar39;
              auVar84._12_4_ = uVar39;
              uVar39 = *(undefined4 *)(uVar43 + 0x60 + lVar32);
              auVar21._4_4_ = uVar39;
              auVar21._0_4_ = uVar39;
              auVar21._8_4_ = uVar39;
              auVar21._12_4_ = uVar39;
              auVar50 = vfmadd213ps_avx512vl(auVar84,auVar68,auVar21);
              uVar39 = *(undefined4 *)(uVar43 + 0xe0 + lVar32);
              auVar87._4_4_ = uVar39;
              auVar87._0_4_ = uVar39;
              auVar87._8_4_ = uVar39;
              auVar87._12_4_ = uVar39;
              uVar39 = *(undefined4 *)(uVar43 + 0x80 + lVar32);
              auVar22._4_4_ = uVar39;
              auVar22._0_4_ = uVar39;
              auVar22._8_4_ = uVar39;
              auVar22._12_4_ = uVar39;
              auVar51 = vfmadd213ps_avx512vl(auVar87,auVar68,auVar22);
              auVar25._8_8_ = tray.org.field_0._8_8_;
              auVar25._0_8_ = tray.org.field_0._0_8_;
              auVar26._8_8_ = tray.org.field_0._24_8_;
              auVar26._0_8_ = tray.org.field_0._16_8_;
              auVar27._8_8_ = tray.org.field_0._40_8_;
              auVar27._0_8_ = tray.org.field_0._32_8_;
              auVar46 = vsubps_avx(auVar46,auVar25);
              auVar91._0_4_ = tray.rdir.field_0._0_4_ * auVar46._0_4_;
              auVar91._4_4_ = tray.rdir.field_0._4_4_ * auVar46._4_4_;
              auVar91._8_4_ = tray.rdir.field_0._8_4_ * auVar46._8_4_;
              auVar91._12_4_ = tray.rdir.field_0._12_4_ * auVar46._12_4_;
              auVar46 = vsubps_avx(auVar47,auVar26);
              auVar78._0_4_ = auVar46._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar78._4_4_ = auVar46._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar78._8_4_ = auVar46._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar78._12_4_ = auVar46._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar46 = vsubps_avx(auVar48,auVar27);
              auVar80._0_4_ = tray.rdir.field_0._32_4_ * auVar46._0_4_;
              auVar80._4_4_ = tray.rdir.field_0._36_4_ * auVar46._4_4_;
              auVar80._8_4_ = tray.rdir.field_0._40_4_ * auVar46._8_4_;
              auVar80._12_4_ = tray.rdir.field_0._44_4_ * auVar46._12_4_;
              auVar46 = vsubps_avx(auVar49,auVar25);
              auVar82._0_4_ = tray.rdir.field_0._0_4_ * auVar46._0_4_;
              auVar82._4_4_ = tray.rdir.field_0._4_4_ * auVar46._4_4_;
              auVar82._8_4_ = tray.rdir.field_0._8_4_ * auVar46._8_4_;
              auVar82._12_4_ = tray.rdir.field_0._12_4_ * auVar46._12_4_;
              auVar46 = vsubps_avx(auVar50,auVar26);
              auVar85._0_4_ = auVar46._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar85._4_4_ = auVar46._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar85._8_4_ = auVar46._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar85._12_4_ = auVar46._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar46 = vsubps_avx(auVar51,auVar27);
              auVar88._0_4_ = tray.rdir.field_0._32_4_ * auVar46._0_4_;
              auVar88._4_4_ = tray.rdir.field_0._36_4_ * auVar46._4_4_;
              auVar88._8_4_ = tray.rdir.field_0._40_4_ * auVar46._8_4_;
              auVar88._12_4_ = tray.rdir.field_0._44_4_ * auVar46._12_4_;
              auVar46 = vpminsd_avx(auVar91,auVar82);
              auVar47 = vpminsd_avx(auVar78,auVar85);
              auVar46 = vpmaxsd_avx(auVar46,auVar47);
              auVar47 = vpminsd_avx(auVar80,auVar88);
              auVar46 = vpmaxsd_avx(auVar46,auVar47);
              auVar48 = vmulps_avx512vl(auVar46,auVar96._0_16_);
              auVar46 = vpmaxsd_avx(auVar91,auVar82);
              auVar47 = vpmaxsd_avx(auVar78,auVar85);
              auVar47 = vpminsd_avx(auVar46,auVar47);
              auVar46 = vpmaxsd_avx(auVar80,auVar88);
              auVar46 = vpminsd_avx(auVar47,auVar46);
              auVar47 = vmulps_avx512vl(auVar46,auVar97._0_16_);
              auVar46 = vpmaxsd_avx(auVar48,(undefined1  [16])tray.tnear.field_0);
              auVar47 = vpminsd_avx(auVar47,(undefined1  [16])tray.tfar.field_0);
              uVar13 = vcmpps_avx512vl(auVar46,auVar47,2);
              bVar28 = (byte)uVar13;
              if ((uVar34 & 7) == 6) {
                uVar39 = *(undefined4 *)(uVar43 + 0x100 + lVar32);
                auVar23._4_4_ = uVar39;
                auVar23._0_4_ = uVar39;
                auVar23._8_4_ = uVar39;
                auVar23._12_4_ = uVar39;
                uVar13 = vcmpps_avx512vl(auVar68,auVar23,1);
                uVar39 = *(undefined4 *)(uVar43 + 0xf0 + lVar32);
                auVar24._4_4_ = uVar39;
                auVar24._0_4_ = uVar39;
                auVar24._8_4_ = uVar39;
                auVar24._12_4_ = uVar39;
                uVar14 = vcmpps_avx512vl(auVar68,auVar24,0xd);
                bVar28 = (byte)uVar13 & (byte)uVar14 & bVar28;
              }
              bVar28 = bVar28 & (byte)uVar11;
              if (bVar28 == 0) {
                auVar75 = ZEXT1664(auVar45);
                root.ptr = sVar35;
              }
              else {
                auVar46 = vblendmps_avx512vl(auVar95._0_16_,auVar48);
                bVar41 = (bool)(bVar28 >> 1 & 1);
                bVar5 = (bool)(bVar28 >> 2 & 1);
                bVar6 = (bool)(bVar28 >> 3 & 1);
                auVar75 = ZEXT1664(CONCAT412((uint)bVar6 * auVar46._12_4_ |
                                             (uint)!bVar6 * auVar68._12_4_,
                                             CONCAT48((uint)bVar5 * auVar46._8_4_ |
                                                      (uint)!bVar5 * auVar68._8_4_,
                                                      CONCAT44((uint)bVar41 * auVar46._4_4_ |
                                                               (uint)!bVar41 * auVar68._4_4_,
                                                               (uint)(bVar28 & 1) * auVar46._0_4_ |
                                                               (uint)!(bool)(bVar28 & 1) *
                                                               auVar68._0_4_))));
                if (sVar35 != 8) {
                  pNVar37->ptr = sVar35;
                  pNVar37 = pNVar37 + 1;
                  *(undefined1 (*) [16])paVar38->v = auVar45;
                  paVar38 = paVar38 + 1;
                }
              }
              auVar45 = auVar75._0_16_;
              lVar32 = lVar32 + 4;
              sVar35 = root.ptr;
            } while (lVar32 != 0);
            iVar30 = 4;
            if (root.ptr == 8) goto LAB_01f3fe99;
            uVar11 = vcmpps_avx512vl((undefined1  [16])auVar75._0_16_,
                                     (undefined1  [16])tray.tfar.field_0,9);
          } while ((byte)uVar36 < (byte)POPCOUNT((int)uVar11));
          pNVar37->ptr = root.ptr;
          pNVar37 = pNVar37 + 1;
          *paVar38 = auVar75._0_16_;
          paVar38 = paVar38 + 1;
        }
        else {
          do {
            sVar35 = 0;
            for (uVar40 = uVar43; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
              sVar35 = sVar35 + 1;
            }
            bVar41 = occluded1(local_1908,local_1910,root,sVar35,&pre,ray,&tray,context);
            bVar28 = (byte)(1 << ((uint)sVar35 & 0x1f));
            if (!bVar41) {
              bVar28 = 0;
            }
            bVar29 = bVar29 | bVar28;
            uVar43 = uVar43 - 1 & uVar43;
          } while (uVar43 != 0);
          iVar30 = 3;
          if (bVar29 != 0xf) {
            auVar45 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)(bVar29 & 1) * auVar45._0_4_ |
                 (uint)!(bool)(bVar29 & 1) * tray.tfar.field_0.i[0];
            bVar41 = (bool)(bVar29 >> 1 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar41 * auVar45._4_4_ | (uint)!bVar41 * tray.tfar.field_0.i[1];
            bVar41 = (bool)(bVar29 >> 2 & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar41 * auVar45._8_4_ | (uint)!bVar41 * tray.tfar.field_0.i[2];
            bVar41 = (bool)(bVar29 >> 3 & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar41 * auVar45._12_4_ | (uint)!bVar41 * tray.tfar.field_0.i[3];
            iVar30 = 2;
          }
          auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar93 = ZEXT1664(auVar45);
          auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar94 = ZEXT1664(auVar45);
          auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar95 = ZEXT1664(auVar45);
          auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar96 = ZEXT1664(auVar45);
          auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar97 = ZEXT1664(auVar45);
          auVar45 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
          auVar98 = ZEXT1664(auVar45);
          auVar75 = ZEXT1664((undefined1  [16])vVar2.field_0);
          if (uVar36 < (uint)POPCOUNT(uVar39)) goto LAB_01f3fc83;
        }
LAB_01f3fe99:
      } while ((iVar30 == 4) || (iVar30 == 2));
LAB_01f4076b:
      bVar29 = bVar29 & bVar42;
      bVar41 = (bool)(bVar29 >> 1 & 1);
      bVar5 = (bool)(bVar29 >> 2 & 1);
      *(uint *)pRVar1 = (uint)(bVar29 & 1) * -0x800000 | (uint)!(bool)(bVar29 & 1) * *(int *)pRVar1;
      *(uint *)(ray + 0x84) = (uint)bVar41 * -0x800000 | (uint)!bVar41 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar29 >> 3) * -0x800000 | (uint)!(bool)(bVar29 >> 3) * *(int *)(ray + 0x8c);
    }
  }
  return;
  while( true ) {
    uVar43 = uVar43 + 1;
    lVar32 = lVar32 + 0x140;
    if (local_1900 <= uVar43) break;
LAB_01f40012:
    uVar40 = 0;
    bVar33 = bVar28;
    while (uVar44 = (ulong)*(uint *)(lVar32 + -0x10 + uVar40 * 4), uVar44 != 0xffffffff) {
      auVar45 = *(undefined1 (*) [16])(ray + 0x70);
      uVar39 = *(undefined4 *)(lVar32 + -0xa0 + uVar40 * 4);
      auVar52._4_4_ = uVar39;
      auVar52._0_4_ = uVar39;
      auVar52._8_4_ = uVar39;
      auVar52._12_4_ = uVar39;
      uVar39 = *(undefined4 *)(lVar32 + -0x90 + uVar40 * 4);
      auVar53._4_4_ = uVar39;
      auVar53._0_4_ = uVar39;
      auVar53._8_4_ = uVar39;
      auVar53._12_4_ = uVar39;
      uVar39 = *(undefined4 *)(lVar32 + -0x80 + uVar40 * 4);
      auVar54._4_4_ = uVar39;
      auVar54._0_4_ = uVar39;
      auVar54._8_4_ = uVar39;
      auVar54._12_4_ = uVar39;
      uVar39 = *(undefined4 *)(lVar32 + -0x130 + uVar40 * 4);
      auVar68._4_4_ = uVar39;
      auVar68._0_4_ = uVar39;
      auVar68._8_4_ = uVar39;
      auVar68._12_4_ = uVar39;
      auVar52 = vfmadd213ps_avx512vl(auVar52,auVar45,auVar68);
      uVar39 = *(undefined4 *)(lVar32 + -0x120 + uVar40 * 4);
      auVar46._4_4_ = uVar39;
      auVar46._0_4_ = uVar39;
      auVar46._8_4_ = uVar39;
      auVar46._12_4_ = uVar39;
      auVar53 = vfmadd213ps_avx512vl(auVar53,auVar45,auVar46);
      uVar39 = *(undefined4 *)(lVar32 + -0x110 + uVar40 * 4);
      auVar47._4_4_ = uVar39;
      auVar47._0_4_ = uVar39;
      auVar47._8_4_ = uVar39;
      auVar47._12_4_ = uVar39;
      auVar54 = vfmadd213ps_avx512vl(auVar54,auVar45,auVar47);
      uVar39 = *(undefined4 *)(lVar32 + -0x70 + uVar40 * 4);
      auVar55._4_4_ = uVar39;
      auVar55._0_4_ = uVar39;
      auVar55._8_4_ = uVar39;
      auVar55._12_4_ = uVar39;
      uVar39 = *(undefined4 *)(lVar32 + -0x60 + uVar40 * 4);
      auVar56._4_4_ = uVar39;
      auVar56._0_4_ = uVar39;
      auVar56._8_4_ = uVar39;
      auVar56._12_4_ = uVar39;
      uVar39 = *(undefined4 *)(lVar32 + -0x50 + uVar40 * 4);
      auVar57._4_4_ = uVar39;
      auVar57._0_4_ = uVar39;
      auVar57._8_4_ = uVar39;
      auVar57._12_4_ = uVar39;
      uVar39 = *(undefined4 *)(lVar32 + -0x100 + uVar40 * 4);
      auVar48._4_4_ = uVar39;
      auVar48._0_4_ = uVar39;
      auVar48._8_4_ = uVar39;
      auVar48._12_4_ = uVar39;
      auVar55 = vfmadd213ps_avx512vl(auVar55,auVar45,auVar48);
      uVar39 = *(undefined4 *)(lVar32 + -0xf0 + uVar40 * 4);
      auVar50._4_4_ = uVar39;
      auVar50._0_4_ = uVar39;
      auVar50._8_4_ = uVar39;
      auVar50._12_4_ = uVar39;
      auVar56 = vfmadd213ps_avx512vl(auVar56,auVar45,auVar50);
      uVar39 = *(undefined4 *)(lVar32 + -0xe0 + uVar40 * 4);
      auVar51._4_4_ = uVar39;
      auVar51._0_4_ = uVar39;
      auVar51._8_4_ = uVar39;
      auVar51._12_4_ = uVar39;
      auVar57 = vfmadd213ps_avx512vl(auVar57,auVar45,auVar51);
      uVar39 = *(undefined4 *)(lVar32 + -0x40 + uVar40 * 4);
      auVar61._4_4_ = uVar39;
      auVar61._0_4_ = uVar39;
      auVar61._8_4_ = uVar39;
      auVar61._12_4_ = uVar39;
      uVar39 = *(undefined4 *)(lVar32 + -0x30 + uVar40 * 4);
      auVar62._4_4_ = uVar39;
      auVar62._0_4_ = uVar39;
      auVar62._8_4_ = uVar39;
      auVar62._12_4_ = uVar39;
      uVar39 = *(undefined4 *)(lVar32 + -0x20 + uVar40 * 4);
      auVar63._4_4_ = uVar39;
      auVar63._0_4_ = uVar39;
      auVar63._8_4_ = uVar39;
      auVar63._12_4_ = uVar39;
      uVar39 = *(undefined4 *)(lVar32 + -0xd0 + uVar40 * 4);
      auVar58._4_4_ = uVar39;
      auVar58._0_4_ = uVar39;
      auVar58._8_4_ = uVar39;
      auVar58._12_4_ = uVar39;
      auVar58 = vfmadd213ps_avx512vl(auVar61,auVar45,auVar58);
      uVar39 = *(undefined4 *)(lVar32 + -0xc0 + uVar40 * 4);
      auVar59._4_4_ = uVar39;
      auVar59._0_4_ = uVar39;
      auVar59._8_4_ = uVar39;
      auVar59._12_4_ = uVar39;
      auVar59 = vfmadd213ps_avx512vl(auVar62,auVar45,auVar59);
      uVar39 = *(undefined4 *)(lVar32 + -0xb0 + uVar40 * 4);
      auVar60._4_4_ = uVar39;
      auVar60._0_4_ = uVar39;
      auVar60._8_4_ = uVar39;
      auVar60._12_4_ = uVar39;
      auVar60 = vfmadd213ps_avx512vl(auVar63,auVar45,auVar60);
      auVar45 = *(undefined1 (*) [16])ray;
      auVar68 = *(undefined1 (*) [16])(ray + 0x10);
      auVar46 = *(undefined1 (*) [16])(ray + 0x20);
      auVar47 = *(undefined1 (*) [16])(ray + 0x40);
      auVar48 = *(undefined1 (*) [16])(ray + 0x50);
      auVar49 = *(undefined1 (*) [16])(ray + 0x60);
      auVar50 = vsubps_avx(auVar52,auVar45);
      auVar51 = vsubps_avx(auVar53,auVar68);
      auVar52 = vsubps_avx512vl(auVar54,auVar46);
      auVar53 = vsubps_avx512vl(auVar55,auVar45);
      auVar54 = vsubps_avx512vl(auVar56,auVar68);
      auVar55 = vsubps_avx512vl(auVar57,auVar46);
      auVar58 = vsubps_avx512vl(auVar58,auVar45);
      auVar59 = vsubps_avx512vl(auVar59,auVar68);
      auVar60 = vsubps_avx512vl(auVar60,auVar46);
      auVar56 = vsubps_avx512vl(auVar58,auVar50);
      auVar57 = vsubps_avx512vl(auVar59,auVar51);
      auVar61 = vsubps_avx512vl(auVar60,auVar52);
      auVar62 = vsubps_avx512vl(auVar50,auVar53);
      auVar63 = vsubps_avx512vl(auVar51,auVar54);
      auVar64 = vsubps_avx512vl(auVar52,auVar55);
      auVar65 = vsubps_avx512vl(auVar53,auVar58);
      auVar66 = vsubps_avx512vl(auVar54,auVar59);
      auVar67 = vsubps_avx512vl(auVar55,auVar60);
      auVar45 = vaddps_avx512vl(auVar58,auVar50);
      auVar68 = vaddps_avx512vl(auVar59,auVar51);
      auVar46 = vaddps_avx512vl(auVar60,auVar52);
      auVar69 = vmulps_avx512vl(auVar68,auVar61);
      auVar69 = vfmsub231ps_avx512vl(auVar69,auVar57,auVar46);
      auVar46 = vmulps_avx512vl(auVar46,auVar56);
      auVar46 = vfmsub231ps_avx512vl(auVar46,auVar61,auVar45);
      auVar70._0_4_ = auVar45._0_4_ * auVar57._0_4_;
      auVar70._4_4_ = auVar45._4_4_ * auVar57._4_4_;
      auVar70._8_4_ = auVar45._8_4_ * auVar57._8_4_;
      auVar70._12_4_ = auVar45._12_4_ * auVar57._12_4_;
      auVar45 = vfmsub231ps_fma(auVar70,auVar56,auVar68);
      fVar7 = auVar49._0_4_;
      auVar90._0_4_ = auVar45._0_4_ * fVar7;
      fVar8 = auVar49._4_4_;
      auVar90._4_4_ = auVar45._4_4_ * fVar8;
      fVar9 = auVar49._8_4_;
      auVar90._8_4_ = auVar45._8_4_ * fVar9;
      fVar10 = auVar49._12_4_;
      auVar90._12_4_ = auVar45._12_4_ * fVar10;
      auVar45 = vfmadd231ps_avx512vl(auVar90,auVar48,auVar46);
      auVar46 = vfmadd231ps_avx512vl(auVar45,auVar47,auVar69);
      auVar45 = vaddps_avx512vl(auVar50,auVar53);
      auVar68 = vaddps_avx512vl(auVar51,auVar54);
      auVar69 = vaddps_avx512vl(auVar52,auVar55);
      auVar70 = vmulps_avx512vl(auVar68,auVar64);
      auVar70 = vfmsub231ps_avx512vl(auVar70,auVar63,auVar69);
      auVar69 = vmulps_avx512vl(auVar69,auVar62);
      auVar69 = vfmsub231ps_avx512vl(auVar69,auVar64,auVar45);
      auVar45 = vmulps_avx512vl(auVar45,auVar63);
      auVar45 = vfmsub231ps_avx512vl(auVar45,auVar62,auVar68);
      auVar92._0_4_ = auVar45._0_4_ * fVar7;
      auVar92._4_4_ = auVar45._4_4_ * fVar8;
      auVar92._8_4_ = auVar45._8_4_ * fVar9;
      auVar92._12_4_ = auVar45._12_4_ * fVar10;
      auVar45 = vfmadd231ps_avx512vl(auVar92,auVar48,auVar69);
      auVar69 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar68 = vfmadd231ps_avx512vl(auVar45,auVar47,auVar70);
      auVar45 = vaddps_avx512vl(auVar53,auVar58);
      auVar58 = vaddps_avx512vl(auVar54,auVar59);
      auVar59 = vaddps_avx512vl(auVar55,auVar60);
      auVar60 = vmulps_avx512vl(auVar58,auVar67);
      auVar60 = vfmsub231ps_avx512vl(auVar60,auVar66,auVar59);
      auVar59 = vmulps_avx512vl(auVar59,auVar65);
      auVar59 = vfmsub231ps_avx512vl(auVar59,auVar67,auVar45);
      auVar45 = vmulps_avx512vl(auVar45,auVar66);
      auVar45 = vfmsub231ps_avx512vl(auVar45,auVar65,auVar58);
      auVar45 = vmulps_avx512vl(auVar45,auVar49);
      auVar45 = vfmadd231ps_avx512vl(auVar45,auVar48,auVar59);
      auVar49 = vfmadd231ps_avx512vl(auVar45,auVar47,auVar60);
      auVar45 = vaddps_avx512vl(auVar46,auVar68);
      auVar45 = vaddps_avx512vl(auVar49,auVar45);
      auVar53 = auVar93._0_16_;
      auVar58 = vandps_avx512vl(auVar45,auVar53);
      auVar58 = vmulps_avx512vl(auVar58,auVar98._0_16_);
      auVar59 = vminps_avx512vl(auVar46,auVar68);
      auVar59 = vminps_avx512vl(auVar59,auVar49);
      auVar60 = vxorps_avx512vl(auVar58,auVar69);
      uVar11 = vcmpps_avx512vl(auVar59,auVar60,5);
      auVar59 = vmaxps_avx512vl(auVar46,auVar68);
      auVar49 = vmaxps_avx512vl(auVar59,auVar49);
      uVar13 = vcmpps_avx512vl(auVar49,auVar58,2);
      bVar31 = ((byte)uVar11 | (byte)uVar13) & 0xf & bVar33;
      auVar49 = auVar94._0_16_;
      if (bVar31 == 0) {
LAB_01f40433:
        bVar31 = 0;
        auVar64 = local_17d8;
        auVar65 = local_17c8;
        auVar66 = local_17b8;
        auVar67 = local_17a8;
        auVar45 = local_1798;
        auVar68 = _local_1788;
        auVar46 = _local_1778;
      }
      else {
        auVar58 = vmulps_avx512vl(auVar63,auVar61);
        auVar59 = vmulps_avx512vl(auVar56,auVar64);
        auVar60 = vmulps_avx512vl(auVar62,auVar57);
        auVar54 = vmulps_avx512vl(auVar66,auVar64);
        auVar55 = vmulps_avx512vl(auVar62,auVar67);
        auVar70 = vmulps_avx512vl(auVar65,auVar63);
        auVar57 = vfmsub213ps_avx512vl(auVar57,auVar64,auVar58);
        auVar61 = vfmsub213ps_avx512vl(auVar61,auVar62,auVar59);
        auVar56 = vfmsub213ps_avx512vl(auVar56,auVar63,auVar60);
        auVar63 = vfmsub213ps_avx512vl(auVar67,auVar63,auVar54);
        auVar64 = vfmsub213ps_avx512vl(auVar65,auVar64,auVar55);
        auVar62 = vfmsub213ps_avx512vl(auVar66,auVar62,auVar70);
        auVar58 = vandps_avx512vl(auVar58,auVar53);
        auVar54 = vandps_avx512vl(auVar54,auVar53);
        uVar12 = vcmpps_avx512vl(auVar58,auVar54,1);
        auVar58 = vandps_avx512vl(auVar59,auVar53);
        auVar59 = vandps_avx512vl(auVar55,auVar53);
        uVar15 = vcmpps_avx512vl(auVar58,auVar59,1);
        auVar58 = vandps_avx512vl(auVar60,auVar53);
        auVar59 = vandps_avx512vl(auVar70,auVar53);
        uVar16 = vcmpps_avx512vl(auVar58,auVar59,1);
        bVar41 = (bool)((byte)uVar12 & 1);
        auVar66._0_4_ = (uint)bVar41 * auVar57._0_4_ | (uint)!bVar41 * auVar63._0_4_;
        bVar41 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar66._4_4_ = (uint)bVar41 * auVar57._4_4_ | (uint)!bVar41 * auVar63._4_4_;
        bVar41 = (bool)((byte)(uVar12 >> 2) & 1);
        auVar66._8_4_ = (uint)bVar41 * auVar57._8_4_ | (uint)!bVar41 * auVar63._8_4_;
        bVar41 = (bool)((byte)(uVar12 >> 3) & 1);
        auVar66._12_4_ = (uint)bVar41 * auVar57._12_4_ | (uint)!bVar41 * auVar63._12_4_;
        bVar41 = (bool)((byte)uVar15 & 1);
        auVar65._0_4_ = (uint)bVar41 * auVar61._0_4_ | (uint)!bVar41 * auVar64._0_4_;
        bVar41 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar65._4_4_ = (uint)bVar41 * auVar61._4_4_ | (uint)!bVar41 * auVar64._4_4_;
        bVar41 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar65._8_4_ = (uint)bVar41 * auVar61._8_4_ | (uint)!bVar41 * auVar64._8_4_;
        bVar41 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar65._12_4_ = (uint)bVar41 * auVar61._12_4_ | (uint)!bVar41 * auVar64._12_4_;
        bVar41 = (bool)((byte)uVar16 & 1);
        auVar64._0_4_ = (float)((uint)bVar41 * auVar56._0_4_ | (uint)!bVar41 * auVar62._0_4_);
        bVar41 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar64._4_4_ = (float)((uint)bVar41 * auVar56._4_4_ | (uint)!bVar41 * auVar62._4_4_);
        bVar41 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar64._8_4_ = (float)((uint)bVar41 * auVar56._8_4_ | (uint)!bVar41 * auVar62._8_4_);
        bVar41 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar64._12_4_ = (float)((uint)bVar41 * auVar56._12_4_ | (uint)!bVar41 * auVar62._12_4_);
        auVar89._0_4_ = fVar7 * auVar64._0_4_;
        auVar89._4_4_ = fVar8 * auVar64._4_4_;
        auVar89._8_4_ = fVar9 * auVar64._8_4_;
        auVar89._12_4_ = fVar10 * auVar64._12_4_;
        auVar48 = vfmadd213ps_fma(auVar48,auVar65,auVar89);
        auVar47 = vfmadd213ps_fma(auVar47,auVar66,auVar48);
        auVar83._0_4_ = auVar47._0_4_ + auVar47._0_4_;
        auVar83._4_4_ = auVar47._4_4_ + auVar47._4_4_;
        auVar83._8_4_ = auVar47._8_4_ + auVar47._8_4_;
        auVar83._12_4_ = auVar47._12_4_ + auVar47._12_4_;
        auVar86._0_4_ = auVar52._0_4_ * auVar64._0_4_;
        auVar86._4_4_ = auVar52._4_4_ * auVar64._4_4_;
        auVar86._8_4_ = auVar52._8_4_ * auVar64._8_4_;
        auVar86._12_4_ = auVar52._12_4_ * auVar64._12_4_;
        auVar47 = vfmadd213ps_fma(auVar51,auVar65,auVar86);
        auVar48 = vfmadd213ps_fma(auVar50,auVar66,auVar47);
        auVar47 = vrcp14ps_avx512vl(auVar83);
        auVar50 = vxorps_avx512vl(auVar83,auVar69);
        auVar51 = vfnmadd213ps_avx512vl(auVar47,auVar83,auVar49);
        auVar47 = vfmadd132ps_fma(auVar51,auVar47,auVar47);
        auVar67._0_4_ = (auVar48._0_4_ + auVar48._0_4_) * auVar47._0_4_;
        auVar67._4_4_ = (auVar48._4_4_ + auVar48._4_4_) * auVar47._4_4_;
        auVar67._8_4_ = (auVar48._8_4_ + auVar48._8_4_) * auVar47._8_4_;
        auVar67._12_4_ = (auVar48._12_4_ + auVar48._12_4_) * auVar47._12_4_;
        uVar11 = vcmpps_avx512vl(auVar67,*(undefined1 (*) [16])(ray + 0x80),2);
        uVar13 = vcmpps_avx512vl(auVar67,*(undefined1 (*) [16])(ray + 0x30),0xd);
        uVar14 = vcmpps_avx512vl(auVar83,auVar50,4);
        bVar31 = bVar31 & (byte)uVar11 & (byte)uVar13 & (byte)uVar14;
        if (bVar31 == 0) goto LAB_01f40433;
      }
      _local_1778 = auVar46;
      _local_1788 = auVar68;
      local_1798 = auVar45;
      local_17a8 = auVar67;
      local_17b8 = auVar66;
      local_17c8 = auVar65;
      local_17d8 = auVar64;
      pGVar3 = (context->scene->geometries).items[uVar44].ptr;
      uVar34 = pGVar3->mask;
      auVar45._4_4_ = uVar34;
      auVar45._0_4_ = uVar34;
      auVar45._8_4_ = uVar34;
      auVar45._12_4_ = uVar34;
      uVar11 = vptestmd_avx512vl(auVar45,*(undefined1 (*) [16])(ray + 0x90));
      bVar31 = (byte)uVar11 & 0xf & bVar31;
      uVar44 = (ulong)bVar31;
      if (bVar31 != 0) {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar45 = vandps_avx512vl(local_1798,auVar53);
          auVar69._8_4_ = 0x219392ef;
          auVar69._0_8_ = 0x219392ef219392ef;
          auVar69._12_4_ = 0x219392ef;
          uVar44 = vcmpps_avx512vl(auVar45,auVar69,5);
          auVar45 = vrcp14ps_avx512vl(local_1798);
          auVar68 = vfnmadd213ps_avx512vl(auVar45,local_1798,auVar49);
          auVar45 = vfmadd132ps_avx512vl(auVar68,auVar45,auVar45);
          fVar7 = (float)((uint)((byte)uVar44 & 1) * auVar45._0_4_);
          fVar8 = (float)((uint)((byte)(uVar44 >> 1) & 1) * auVar45._4_4_);
          fVar9 = (float)((uint)((byte)(uVar44 >> 2) & 1) * auVar45._8_4_);
          fVar10 = (float)((uint)((byte)(uVar44 >> 3) & 1) * auVar45._12_4_);
          auVar73._0_4_ = fVar7 * (float)local_1778._0_4_;
          auVar73._4_4_ = fVar8 * (float)local_1778._4_4_;
          auVar73._8_4_ = fVar9 * fStack_1770;
          auVar73._12_4_ = fVar10 * fStack_176c;
          local_1738 = vminps_avx512vl(auVar73,auVar49);
          auVar74._0_4_ = fVar7 * (float)local_1788._0_4_;
          auVar74._4_4_ = fVar8 * (float)local_1788._4_4_;
          auVar74._8_4_ = fVar9 * fStack_1780;
          auVar74._12_4_ = fVar10 * fStack_177c;
          local_1728 = vminps_avx512vl(auVar74,auVar49);
          local_1708 = vpbroadcastd_avx512vl();
          local_1718 = vpbroadcastd_avx512vl();
          local_1768 = local_17b8._0_8_;
          uStack_1760 = local_17b8._8_8_;
          local_1758 = local_17c8._0_8_;
          uStack_1750 = local_17c8._8_8_;
          local_1748 = local_17d8;
          vpcmpeqd_avx2(ZEXT1632(local_1738),ZEXT1632(local_1738));
          uStack_16f4 = context->user->instID[0];
          local_16f8 = uStack_16f4;
          uStack_16f0 = uStack_16f4;
          uStack_16ec = uStack_16f4;
          uStack_16e8 = context->user->instPrimID[0];
          uStack_16e4 = uStack_16e8;
          uStack_16e0 = uStack_16e8;
          uStack_16dc = uStack_16e8;
          local_18f8 = *(undefined1 (*) [16])(ray + 0x80);
          auVar45 = vblendmps_avx512vl(local_18f8,local_17a8);
          bVar41 = (bool)(bVar31 >> 1 & 1);
          bVar5 = (bool)(bVar31 >> 2 & 1);
          *(uint *)(ray + 0x80) =
               (uint)(bVar31 & 1) * auVar45._0_4_ | !(bool)(bVar31 & 1) * uStack_16e8;
          *(uint *)(ray + 0x84) = (uint)bVar41 * auVar45._4_4_ | !bVar41 * uStack_16e8;
          *(uint *)(ray + 0x88) = (uint)bVar5 * auVar45._8_4_ | !bVar5 * uStack_16e8;
          *(uint *)(ray + 0x8c) =
               (uint)(bVar31 >> 3) * auVar45._12_4_ | !(bool)(bVar31 >> 3) * uStack_16e8;
          local_1928 = vpmovm2d_avx512vl((ulong)bVar31);
          args.valid = (int *)local_1928;
          args.geometryUserPtr = pGVar3->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          args.ray = (RTCRayN *)ray;
          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar3->occlusionFilterN)(&args);
            auVar45 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
            auVar98 = ZEXT1664(auVar45);
            auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
            auVar97 = ZEXT1664(auVar45);
            auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar96 = ZEXT1664(auVar45);
            auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar95 = ZEXT1664(auVar45);
            auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar94 = ZEXT1664(auVar45);
            auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar93 = ZEXT1664(auVar45);
          }
          uVar44 = vptestmd_avx512vl(local_1928,local_1928);
          if ((uVar44 & 0xf) == 0) {
            uVar44 = 0;
          }
          else {
            p_Var4 = context->args->filter;
            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var4)(&args);
              auVar45 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
              auVar98 = ZEXT1664(auVar45);
              auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
              auVar97 = ZEXT1664(auVar45);
              auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar96 = ZEXT1664(auVar45);
              auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar95 = ZEXT1664(auVar45);
              auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar94 = ZEXT1664(auVar45);
              auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar93 = ZEXT1664(auVar45);
            }
            uVar44 = vptestmd_avx512vl(local_1928,local_1928);
            uVar44 = uVar44 & 0xf;
            auVar45 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar41 = (bool)((byte)uVar44 & 1);
            auVar71._0_4_ = (uint)bVar41 * auVar45._0_4_ | (uint)!bVar41 * *(int *)(args.ray + 0x80)
            ;
            bVar41 = (bool)((byte)(uVar44 >> 1) & 1);
            auVar71._4_4_ = (uint)bVar41 * auVar45._4_4_ | (uint)!bVar41 * *(int *)(args.ray + 0x84)
            ;
            bVar41 = (bool)((byte)(uVar44 >> 2) & 1);
            auVar71._8_4_ = (uint)bVar41 * auVar45._8_4_ | (uint)!bVar41 * *(int *)(args.ray + 0x88)
            ;
            bVar41 = SUB81(uVar44 >> 3,0);
            auVar71._12_4_ =
                 (uint)bVar41 * auVar45._12_4_ | (uint)!bVar41 * *(int *)(args.ray + 0x8c);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar71;
          }
          bVar41 = (bool)((byte)uVar44 & 1);
          auVar72._0_4_ = (uint)bVar41 * *(int *)pRVar1 | (uint)!bVar41 * local_18f8._0_4_;
          bVar41 = (bool)((byte)(uVar44 >> 1) & 1);
          auVar72._4_4_ = (uint)bVar41 * *(int *)(ray + 0x84) | (uint)!bVar41 * local_18f8._4_4_;
          bVar41 = (bool)((byte)(uVar44 >> 2) & 1);
          auVar72._8_4_ = (uint)bVar41 * *(int *)(ray + 0x88) | (uint)!bVar41 * local_18f8._8_4_;
          bVar41 = SUB81(uVar44 >> 3,0);
          auVar72._12_4_ = (uint)bVar41 * *(int *)(ray + 0x8c) | (uint)!bVar41 * local_18f8._12_4_;
          *(undefined1 (*) [16])pRVar1 = auVar72;
        }
        bVar33 = ((byte)uVar44 ^ 0xf) & bVar33;
      }
      if ((bVar33 == 0) || (bVar41 = 2 < uVar40, uVar40 = uVar40 + 1, bVar41)) break;
    }
    bVar28 = bVar28 & bVar33;
    if (bVar28 == 0) break;
  }
  bVar28 = bVar28 ^ 0xf;
LAB_01f4073b:
  bVar29 = bVar28 | bVar29;
  if (bVar29 == 0xf) {
    bVar29 = 0xf;
    goto LAB_01f4076b;
  }
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  tray.tfar.field_0.i[0] =
       (uint)(bVar29 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar29 & 1) * tray.tfar.field_0.i[0];
  bVar41 = (bool)(bVar29 >> 1 & 1);
  tray.tfar.field_0.i[1] = (uint)bVar41 * auVar45._4_4_ | (uint)!bVar41 * tray.tfar.field_0.i[1];
  bVar41 = (bool)(bVar29 >> 2 & 1);
  tray.tfar.field_0.i[2] = (uint)bVar41 * auVar45._8_4_ | (uint)!bVar41 * tray.tfar.field_0.i[2];
  bVar41 = (bool)(bVar29 >> 3 & 1);
  tray.tfar.field_0.i[3] = (uint)bVar41 * auVar45._12_4_ | (uint)!bVar41 * tray.tfar.field_0.i[3];
  goto LAB_01f3fc3b;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }